

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::unaligned_assign_impl<false>::
     run<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::SwapWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>>
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *src,
               SwapWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
               *dst,Index start,Index end)

{
  undefined8 local_30;
  Index index;
  Index end_local;
  Index start_local;
  SwapWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *dst_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *src_local;
  
  for (local_30 = start; local_30 < end; local_30 = local_30 + 1) {
    SwapWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
    copyCoeff<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((SwapWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)dst,
               local_30,(DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                         *)src);
  }
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(const Derived& src, OtherDerived& dst, typename Derived::Index start, typename Derived::Index end)
#endif
  {
    for (typename Derived::Index index = start; index < end; ++index)
      dst.copyCoeff(index, src);
  }